

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void init_single_inter_mode_search_state(InterModeSearchState *search_state)

{
  undefined8 *puVar1;
  long in_RDI;
  int ref_frame_1;
  SingleInterModeState *state;
  int ref_frame;
  int mode;
  int dir;
  int local_24;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
        puVar1 = (undefined8 *)
                 (in_RDI + 0x2d98 + (long)local_c * 0x100 + (long)local_10 * 0x40 +
                 (long)local_14 * 0x10);
        *(undefined1 *)(puVar1 + 1) = 0xff;
        *puVar1 = 0x7fffffffffffffff;
        puVar1 = (undefined8 *)
                 (in_RDI + 0x2fb8 + (long)local_c * 0x100 + (long)local_10 * 0x40 +
                 (long)local_14 * 0x10);
        *(undefined1 *)(puVar1 + 1) = 0xff;
        *puVar1 = 0x7fffffffffffffff;
        *(undefined1 *)
         (in_RDI + 0x31d8 + (long)local_c * 0x10 + (long)local_10 * 4 + (long)local_14) = 0xff;
      }
    }
  }
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    *(undefined8 *)(in_RDI + 0x2d50 + (long)local_24 * 8) = 0x7fffffffffffffff;
    *(undefined1 *)(in_RDI + 0x2d90 + (long)local_24) = 0x19;
  }
  memset((void *)(in_RDI + 0x2f98),0,0x20);
  memset((void *)(in_RDI + 0x31b8),0,0x20);
  return;
}

Assistant:

static inline void init_single_inter_mode_search_state(
    InterModeSearchState *search_state) {
  for (int dir = 0; dir < 2; ++dir) {
    for (int mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      for (int ref_frame = 0; ref_frame < FWD_REFS; ++ref_frame) {
        SingleInterModeState *state;

        state = &search_state->single_state[dir][mode][ref_frame];
        state->ref_frame = NONE_FRAME;
        state->rd = INT64_MAX;

        state = &search_state->single_state_modelled[dir][mode][ref_frame];
        state->ref_frame = NONE_FRAME;
        state->rd = INT64_MAX;

        search_state->single_rd_order[dir][mode][ref_frame] = NONE_FRAME;
      }
    }
  }

  for (int ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame) {
    search_state->best_single_rd[ref_frame] = INT64_MAX;
    search_state->best_single_mode[ref_frame] = PRED_MODE_INVALID;
  }
  av1_zero(search_state->single_state_cnt);
  av1_zero(search_state->single_state_modelled_cnt);
}